

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_group.hpp
# Opt level: O1

void __thiscall
oqpi::
parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
::executeSingleThreadedImpl
          (parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
           *this)

{
  atomic<bool> *paVar1;
  __int_type _Var2;
  pointer ptVar3;
  pointer ptVar4;
  code *pcVar5;
  eAssertResult eVar6;
  ulong uVar7;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar8;
  __int_type_conflict _Var9;
  long lVar10;
  
  uVar7 = 0;
  paVar1 = &(this->
            super_task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
            ).super_task_group_base.super_task_base.grabbed_;
  LOCK();
  _Var2 = (paVar1->_M_base)._M_i;
  if (_Var2 == false) {
    (paVar1->_M_base)._M_i = true;
  }
  else {
    uVar7 = (ulong)_Var2;
  }
  UNLOCK();
  if (_Var2 == false) {
    ptVar3 = (this->tasks_).
             super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>._M_impl.
             super__Vector_impl_data._M_start;
    ptVar4 = (this->tasks_).
             super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar8 = (long)ptVar4 - (long)ptVar3;
    if (lVar8 == 0) {
      eVar6 = assert_function("/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/include/oqpi/scheduling/parallel_group.hpp"
                              ,0x34,"taskCount > 0","",in_R8,in_R9,uVar7);
      if (eVar6 == eAR_Retry) {
        pcVar5 = (code *)swi(3);
        (*pcVar5)();
        return;
      }
    }
    else {
      _Var9 = lVar8 >> 4;
      if ((executeSingleThreadedImpl::always_ignore == false) &&
         (_Var9 != (this->activeTasksCount_).super___atomic_base<unsigned_long>._M_i)) {
        eVar6 = assert_function("/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/include/oqpi/scheduling/parallel_group.hpp"
                                ,0x36,"(taskCount == activeTasksCount_)","",in_R8,in_R9,uVar7);
        if (eVar6 == eAR_AlwaysIgnore) {
          executeSingleThreadedImpl::always_ignore = true;
        }
        else if (eVar6 == eAR_Retry) {
          pcVar5 = (code *)swi(3);
          (*pcVar5)();
          return;
        }
      }
      if (ptVar4 != ptVar3) {
        lVar8 = _Var9 + (_Var9 == 0);
        lVar10 = 0;
        do {
          ptVar3 = (this->tasks_).
                   super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>._M_impl
                   .super__Vector_impl_data._M_start;
          task_handle::validate
                    ((task_handle *)
                     ((long)&(ptVar3->spTask_).
                             super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     + lVar10));
          (**(code **)(**(long **)((long)&(ptVar3->spTask_).
                                          super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr + lVar10) + 0x18))();
          lVar10 = lVar10 + 0x10;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
      }
    }
    std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::clear(&this->tasks_);
    return;
  }
  return;
}

Assistant:

virtual void executeSingleThreadedImpl() override final
        {
            if (task_base::tryGrab())
            {
                const auto taskCount = tasks_.size();
                if (oqpi_ensure(taskCount > 0))
                {
                    oqpi_check(taskCount == activeTasksCount_);
                    for (size_t i = 0; i < taskCount; ++i)
                    {
                        tasks_[i].executeSingleThreaded();
                    }
                }
                tasks_.clear();
            }
        }